

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

void Abc_AigCheckFaninOrder(Abc_Aig_t *pMan)

{
  int *piVar1;
  void **ppvVar2;
  Abc_Obj_t *pAVar3;
  long lVar4;
  
  if (0 < pMan->nBins) {
    lVar4 = 0;
    do {
      for (pAVar3 = pMan->pBins[lVar4]; pAVar3 != (Abc_Obj_t *)0x0; pAVar3 = pAVar3->pNext) {
        piVar1 = (pAVar3->vFanins).pArray;
        ppvVar2 = pAVar3->pNtk->vObjs->pArray;
        if (*(int *)(((ulong)ppvVar2[piVar1[1]] & 0xfffffffffffffffe) + 0x10) <
            *(int *)(((ulong)ppvVar2[*piVar1] & 0xfffffffffffffffe) + 0x10)) {
          printf("Node %d has incorrect ordering of fanins.\n",(ulong)(uint)pAVar3->Id);
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pMan->nBins);
  }
  return;
}

Assistant:

void Abc_AigCheckFaninOrder( Abc_Aig_t * pMan )
{
    Abc_Obj_t * pEnt;
    int i;
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pEnt )
        {
            if ( Abc_ObjRegular(Abc_ObjChild0(pEnt))->Id > Abc_ObjRegular(Abc_ObjChild1(pEnt))->Id )
            {
//                int i0 = Abc_ObjRegular(Abc_ObjChild0(pEnt))->Id;
//                int i1 = Abc_ObjRegular(Abc_ObjChild1(pEnt))->Id;
                printf( "Node %d has incorrect ordering of fanins.\n", pEnt->Id );
            }
        }
}